

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_stress_test.cpp
# Opt level: O0

void __thiscall density_tests::anon_unknown_5::page_warehouse::allocation_loop(page_warehouse *this)

{
  bool bVar1;
  size_type sVar2;
  bool bVar3;
  void *local_78;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60 [3];
  ulong local_48;
  size_t index;
  unsigned_long word_count;
  uintptr_t *words;
  void *local_28;
  void *new_page;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_18;
  bool zeroed;
  time_point start_time;
  page_warehouse *this_local;
  
  start_time.__d.__r = (duration)(duration)this;
  tStack_18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  new_page._7_1_ = 0;
  do {
    new_page._7_1_ = (new_page._7_1_ ^ 0xff) & 1;
    if (new_page._7_1_ == 0) {
      local_78 = density::basic_default_allocator<65536UL>::try_allocate_page
                           ((basic_default_allocator<65536UL> *)((long)&words + 6),progress_blocking
                           );
    }
    else {
      local_78 = density::basic_default_allocator<65536UL>::try_allocate_page_zeroed
                           ((basic_default_allocator<65536UL> *)((long)&words + 7),progress_blocking
                           );
    }
    local_28 = local_78;
    if (local_78 == (void *)0x0) {
      return;
    }
    word_count = (unsigned_long)local_78;
    index = 0x1ffe;
    for (local_48 = 0; local_48 < 0x1ffe; local_48 = local_48 + 1) {
      if (((new_page._7_1_ & 1) != 0) && (*(long *)(word_count + local_48 * 8) != 0)) {
        detail::assert_failed<>
                  ("words[index] == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/test_framework/allocator_stress_test.cpp"
                   ,0x5a);
      }
      *(void **)(word_count + local_48 * 8) = local_28;
    }
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_allocated_pages,&local_28);
    local_68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_60[0].__r = (rep)std::chrono::operator-(&local_68,&stack0xffffffffffffffe8);
    bVar1 = std::chrono::operator<(local_60,&this->m_timeout);
    bVar3 = false;
    if (bVar1) {
      sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_allocated_pages);
      bVar3 = sVar2 < this->m_max_pages;
    }
  } while (bVar3);
  return;
}

Assistant:

void allocation_loop()
            {
                auto const start_time = clock::now();
                bool       zeroed     = false;
                do
                {
                    zeroed = !zeroed;

                    // allocate a page
                    auto const new_page = zeroed
                                            ? density::default_allocator().try_allocate_page_zeroed(
                                                density::progress_blocking)
                                            : density::default_allocator().try_allocate_page(
                                                density::progress_blocking);
                    if (new_page == nullptr)
                        break;

                    // fill it with its own address
                    auto const words = static_cast<uintptr_t *>(new_page);
                    auto const word_count =
                      density::default_allocator::page_size / sizeof(uintptr_t);
                    for (size_t index = 0; index < word_count; index++)
                    {
                        if (zeroed)
                        {
                            DENSITY_TEST_ASSERT(words[index] == 0);
                        }
                        words[index] = reinterpret_cast<uintptr_t>(new_page);
                    }

                    // push in m_allocated_pages.back.push_back(new_page);
                    try
                    {
                        m_allocated_pages.push_back(new_page);
                    }
                    catch (...)
                    {
                        density::default_allocator().deallocate_page(new_page);
                        throw;
                    }

                } while (clock::now() - start_time < m_timeout &&
                         m_allocated_pages.size() < m_max_pages);
            }